

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O2

int pitch_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  info->name = "pitch";
  info->description = "Shift the pitch of the audio.";
  info->flags = MIXED_IN;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,0x17,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The amount of change in pitch that is excised.");
  set_info_field(info->fields + 2,2,8,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The samplerate at which the segment operates.");
  set_info_field(info->fields + 3,0x29,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "How much of the output to mix with the input.");
  set_info_field(info->fields + 4,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  clear_info_field(info->fields + 5);
  return 1;
}

Assistant:

int pitch_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  
  info->name = "pitch";
  info->description = "Shift the pitch of the audio.";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_PITCH_SHIFT,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The amount of change in pitch that is excised.");

  set_info_field(field++, MIXED_SAMPLERATE,
                 MIXED_UINT32, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The samplerate at which the segment operates.");

  set_info_field(field++, MIXED_MIX,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "How much of the output to mix with the input.");

  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");
  
  clear_info_field(field++);
  return 1;
}